

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kliveness.c
# Opt level: O0

Vec_Ptr_t * collectUserGivenDisjunctiveMonotoneSignals(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pObj_00;
  char *pcVar2;
  Vec_Int_t *Entry;
  Vec_Int_t *newIntVector;
  Vec_Ptr_t *monotoneVector;
  int i;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtk_local;
  
  pNtk_local = (Abc_Ntk_t *)Vec_PtrAlloc(0);
  for (monotoneVector._4_4_ = 0; iVar1 = Abc_NtkPoNum(pNtk), monotoneVector._4_4_ < iVar1;
      monotoneVector._4_4_ = monotoneVector._4_4_ + 1) {
    pObj_00 = Abc_NtkPo(pNtk,monotoneVector._4_4_);
    pcVar2 = Abc_ObjName(pObj_00);
    pcVar2 = strstr(pcVar2,"csLevel1Stabil_");
    if (pcVar2 != (char *)0x0) {
      Entry = createSingletonIntVector(monotoneVector._4_4_);
      Vec_PtrPush((Vec_Ptr_t *)pNtk_local,Entry);
    }
  }
  iVar1 = Vec_PtrSize((Vec_Ptr_t *)pNtk_local);
  if (iVar1 < 1) {
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  return (Vec_Ptr_t *)pNtk_local;
}

Assistant:

Vec_Ptr_t *collectUserGivenDisjunctiveMonotoneSignals( Abc_Ntk_t *pNtk )
{
	Abc_Obj_t *pObj;
	int i;
	Vec_Ptr_t *monotoneVector;
	Vec_Int_t *newIntVector;

	monotoneVector = Vec_PtrAlloc(0);	
	Abc_NtkForEachPo( pNtk, pObj, i )
	{
		if( strstr( Abc_ObjName( pObj ), "csLevel1Stabil_" ) != NULL )
		{
			newIntVector = createSingletonIntVector(i);
			Vec_PtrPush(monotoneVector, newIntVector);
		}
	}

	if( Vec_PtrSize(monotoneVector) > 0 )
		return monotoneVector;
	else
		return NULL;

}